

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O0

int redisFormatCommandArgv(char **target,int argc,char **argv,size_t *argvlen)

{
  uint32_t uVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  size_t local_60;
  size_t local_58;
  int local_50;
  int local_4c;
  int j;
  int totlen;
  size_t len;
  int pos;
  char *cmd;
  size_t *argvlen_local;
  char **argv_local;
  int argc_local;
  char **target_local;
  
  if (target == (char **)0x0) {
    target_local._4_4_ = -1;
  }
  else {
    uVar1 = countDigits((long)argc);
    local_4c = uVar1 + 3;
    for (local_50 = 0; local_50 < argc; local_50 = local_50 + 1) {
      if (argvlen == (size_t *)0x0) {
        local_58 = strlen(argv[local_50]);
      }
      else {
        local_58 = argvlen[local_50];
      }
      sVar3 = bulklen(local_58);
      local_4c = local_4c + (int)sVar3;
    }
    __s = (char *)malloc((long)(local_4c + 1));
    if (__s == (char *)0x0) {
      target_local._4_4_ = -1;
    }
    else {
      len._4_4_ = sprintf(__s,"*%d\r\n",(ulong)(uint)argc);
      for (local_50 = 0; local_50 < argc; local_50 = local_50 + 1) {
        if (argvlen == (size_t *)0x0) {
          local_60 = strlen(argv[local_50]);
        }
        else {
          local_60 = argvlen[local_50];
        }
        iVar2 = sprintf(__s + len._4_4_,"$%zu\r\n",local_60);
        memcpy(__s + (iVar2 + len._4_4_),argv[local_50],local_60);
        iVar2 = iVar2 + len._4_4_ + (int)local_60;
        __s[iVar2] = '\r';
        len._4_4_ = iVar2 + 2;
        __s[iVar2 + 1] = '\n';
      }
      if (len._4_4_ != local_4c) {
        __assert_fail("pos == totlen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/hiredis.c"
                      ,0x276,
                      "int redisFormatCommandArgv(char **, int, const char **, const size_t *)");
      }
      __s[len._4_4_] = '\0';
      *target = __s;
      target_local._4_4_ = local_4c;
    }
  }
  return target_local._4_4_;
}

Assistant:

int redisFormatCommandArgv(char **target, int argc, const char **argv, const size_t *argvlen) {
    char *cmd = NULL; /* final command */
    int pos; /* position in final command */
    size_t len;
    int totlen, j;

    /* Abort on a NULL target */
    if (target == NULL)
        return -1;

    /* Calculate number of bytes needed for the command */
    totlen = 1+countDigits(argc)+2;
    for (j = 0; j < argc; j++) {
        len = argvlen ? argvlen[j] : strlen(argv[j]);
        totlen += bulklen(len);
    }

    /* Build the command at protocol level */
    cmd = malloc(totlen+1);
    if (cmd == NULL)
        return -1;

    pos = sprintf(cmd,"*%d\r\n",argc);
    for (j = 0; j < argc; j++) {
        len = argvlen ? argvlen[j] : strlen(argv[j]);
        pos += sprintf(cmd+pos,"$%zu\r\n",len);
        memcpy(cmd+pos,argv[j],len);
        pos += len;
        cmd[pos++] = '\r';
        cmd[pos++] = '\n';
    }
    assert(pos == totlen);
    cmd[pos] = '\0';

    *target = cmd;
    return totlen;
}